

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_states.hpp
# Opt level: O0

event_set * __thiscall
afsm::detail::
state_machine_base_impl<afsm::test::ortho_sm_def::on::error,_afsm::none,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on::error,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>
::current_handled_events
          (event_set *__return_storage_ptr__,
          state_machine_base_impl<afsm::test::ortho_sm_def::on::error,_afsm::none,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on::error,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>
          *this)

{
  event_set *this_00;
  iterator __first;
  iterator __last;
  event_set *intl;
  state_machine_base_impl<afsm::test::ortho_sm_def::on::error,_afsm::none,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on::error,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>
  *this_local;
  event_set *res;
  
  this_00 = state_base_impl<afsm::test::ortho_sm_def::on::error,_false>::internal_handled_events();
  transitions::
  state_transition_table<afsm::inner_state_machine<afsm::test::ortho_sm_def::on::error,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::test::ortho_sm_def::on::error,_unsigned_long>
  ::current_handled_events
            (__return_storage_ptr__,
             (state_transition_table<afsm::inner_state_machine<afsm::test::ortho_sm_def::on::error,_afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::test::ortho_sm_def::on::error,_unsigned_long>
              *)this);
  __first = std::
            set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
            ::begin(this_00);
  __last = std::
           set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
           ::end(this_00);
  std::
  set<afsm::detail::event_base::id_type_const*,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
  ::insert<std::_Rb_tree_const_iterator<afsm::detail::event_base::id_type_const*>>
            ((set<afsm::detail::event_base::id_type_const*,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
              *)__return_storage_ptr__,
             (_Rb_tree_const_iterator<const_afsm::detail::event_base::id_type_*>)__first._M_node,
             (_Rb_tree_const_iterator<const_afsm::detail::event_base::id_type_*>)__last._M_node);
  return __return_storage_ptr__;
}

Assistant:

event_set
    current_handled_events() const
    {
        auto const& intl = state_type::internal_handled_events();
        auto res = transitions_.current_handled_events();
        res.insert(intl.begin(), intl.end());
        return res;
    }